

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

ByteData * __thiscall
cfd::TransactionContext::CreateSignatureHash
          (TransactionContext *this,OutPoint *outpoint,Script *redeem_script,
          SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  undefined4 uVar1;
  undefined8 in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  ByteData *in_RDI;
  SigHashType *in_R8;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  ByteData256 sighash;
  vector local_98 [44];
  SigHashType local_6c [12];
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  undefined8 local_30;
  
  local_30 = in_R9;
  uVar1 = (**(code **)((in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0x78))(in_RSI,in_RDX);
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_6c,in_R8);
  cfd::core::Transaction::GetSignatureHash
            (local_48,in_RSI,uVar1,local_60,local_6c,local_30,in_stack_00000008);
  core::ByteData::~ByteData((ByteData *)0x3b0d15);
  cfd::core::ByteData256::GetBytes();
  cfd::core::ByteData::ByteData(in_RDI,local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RSI);
  core::ByteData256::~ByteData256((ByteData256 *)0x3b0d51);
  return in_RDI;
}

Assistant:

ByteData TransactionContext::CreateSignatureHash(
    const OutPoint& outpoint, const Script& redeem_script,
    SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  // TODO(k-matsuzawa): For now, when using OP_CODESEPARATOR, divide it on the user side and ask them to specify only the applicable part.  // NOLINT
  ByteData256 sighash = GetSignatureHash(
      GetTxInIndex(outpoint), redeem_script.GetData(), sighash_type, value,
      version);
  return ByteData(sighash.GetBytes());
}